

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::SampleMean
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  reference pvVar5;
  size_type sVar6;
  reference ppVar7;
  reference ppVar8;
  reference piVar9;
  size_type sVar10;
  mapped_type_conflict3 *pmVar11;
  reference ppVar12;
  mapped_type *pmVar13;
  undefined4 in_register_0000000c;
  long *plVar14;
  float fVar15;
  int in_stack_00000008;
  float local_238;
  code *local_230;
  code *local_1f8;
  summary_id_period_key local_1d8;
  pair<const_summary_id_period_key,_float> s_1;
  iterator __end3_1;
  iterator __begin3_1;
  map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
  *__range3_1;
  undefined4 local_1a8;
  summary_id_period_key sk_1;
  int sidx;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  undefined4 uStack_180;
  pair<const_outkey2,_OutLosses> x_1;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> ensemble;
  iterator __end2;
  iterator __begin2;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range2;
  summary_id_period_key local_118;
  pair<const_summary_id_period_key,_float> s;
  iterator __end1_1;
  iterator __begin1_1;
  map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
  *__range1_1;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  mean_map;
  key_type local_b0;
  summary_id_period_key sk;
  pair<const_outkey2,_OutLosses> x;
  _Self local_88;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
  items;
  int eptype_local;
  int epcalc_local;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  if (this->samplesize_ != 0) {
    items._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = eptype_tvar;
    items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = eptype;
    std::
    map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
    ::map((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
           *)&__range1);
    pvVar5 = std::
             vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             ::operator[](this->out_loss_,1);
    __end1 = std::
             map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
             ::begin(pvVar5);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
         ::end(pvVar5);
    while (bVar4 = std::operator!=(&__end1,&local_88), bVar4) {
      ppVar8 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end1);
      x.first.sidx = (int)(ppVar8->second).max_out_loss;
      local_b0.summary_id = (ppVar8->first).summary_id;
      local_b0.period_no = (ppVar8->first).period_no;
      x.first.summary_id = (ppVar8->first).sidx;
      x.first.period_no = (int)(ppVar8->second).agg_out_loss;
      plVar14 = (long *)((long)&x.first.period_no + CONCAT44(in_register_0000000c,epcalc));
      local_1f8 = (code *)GetOutLoss;
      if ((GetOutLoss & 1) != 0) {
        local_1f8 = *(code **)(*plVar14 + (GetOutLoss - 1));
      }
      sk.summary_id = local_b0.summary_id;
      sk.period_no = local_b0.period_no;
      fVar15 = (float)(*local_1f8)(plVar14);
      iVar1 = this->samplesize_;
      pmVar11 = std::
                map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                ::operator[]((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                              *)&__range1,&local_b0);
      *pmVar11 = fVar15 / (float)iVar1 + *pmVar11;
      std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end1);
    }
    std::
    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::map((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
           *)&__range1_1);
    __end1_1 = std::
               map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
               ::begin((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                        *)&__range1);
    register0x00000000 =
         std::
         map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
         ::end((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                *)&__range1);
    while (bVar4 = std::operator!=(&__end1_1,(_Self *)&s.second), bVar4) {
      ppVar12 = std::_Rb_tree_iterator<std::pair<const_summary_id_period_key,_float>_>::operator*
                          (&__end1_1);
      s.first.summary_id = (int)ppVar12->second;
      local_118 = ppVar12->first;
      pmVar13 = std::
                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                              *)&__range1_1,&local_118.summary_id);
      std::vector<float,_std::allocator<float>_>::push_back(pmVar13,(value_type_conflict2 *)&s);
      std::_Rb_tree_iterator<std::pair<const_summary_id_period_key,_float>_>::operator++(&__end1_1);
    }
    WriteExceedanceProbabilityTable
              (this,fileIDs,
               (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)&__range1_1,(double)this->totalperiods_,
               items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
               (int)items._M_t._M_impl.super__Rb_tree_header._M_node_count,in_stack_00000008,1);
    if (((this->ordFlag_ & 1U) == 0) &&
       (sVar6 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::size(&this->ensembletosidx_), sVar6 != 0)) {
      __end2 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::begin(&this->ensembletosidx_);
      ensemble.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::end(&this->ensembletosidx_);
      while (bVar4 = std::operator!=(&__end2,(_Self *)&ensemble.second.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data.
                                                       _M_end_of_storage), bVar4) {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
                 operator*(&__end2);
        std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                  ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&__range3,ppVar7);
        std::
        map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
        ::clear((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                 *)&__range1);
        pvVar5 = std::
                 vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                 ::operator[](this->out_loss_,1);
        __end3 = std::
                 map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                 ::begin(pvVar5);
        x_1.second = (OutLosses)
                     std::
                     map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                     ::end(pvVar5);
        while (bVar4 = std::operator!=(&__end3,(_Self *)&x_1.second), bVar4) {
          ppVar8 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end3);
          uVar2 = (ppVar8->first).summary_id;
          uVar3 = (ppVar8->first).period_no;
          x_1.first._0_8_ = *(undefined8 *)&(ppVar8->first).sidx;
          x_1.first.sidx = (int)(ppVar8->second).max_out_loss;
          __end4 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)&ensemble);
          register0x00000000 =
               std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)&ensemble);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                             *)&sk_1.period_no), bVar4) {
            piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end4);
            sk_1.summary_id = *piVar9;
            if (x_1.first.summary_id == sk_1.summary_id) {
              __range3_1._4_4_ = uVar2;
              local_1a8 = uVar3;
              plVar14 = (long *)((long)&x_1.first.period_no + CONCAT44(in_register_0000000c,epcalc))
              ;
              local_230 = (code *)GetOutLoss;
              if ((GetOutLoss & 1) != 0) {
                local_230 = *(code **)(*plVar14 + (GetOutLoss - 1));
              }
              fVar15 = (float)(*local_230)(plVar14);
              sVar10 = std::vector<int,_std::allocator<int>_>::size
                                 ((vector<int,_std::allocator<int>_> *)&ensemble);
              local_238 = (float)sVar10;
              pmVar11 = std::
                        map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                        ::operator[]((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                                      *)&__range1,(key_type *)((long)&__range3_1 + 4));
              *pmVar11 = fVar15 / local_238 + *pmVar11;
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end4);
          }
          std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end3);
        }
        std::
        map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::clear((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                 *)&__range1_1);
        __end3_1 = std::
                   map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                   ::begin((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                            *)&__range1);
        register0x00000000 =
             std::
             map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
             ::end((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
                    *)&__range1);
        while (bVar4 = std::operator!=(&__end3_1,(_Self *)&s_1.second), bVar4) {
          ppVar12 = std::_Rb_tree_iterator<std::pair<const_summary_id_period_key,_float>_>::
                    operator*(&__end3_1);
          s_1.first.summary_id = (int)ppVar12->second;
          local_1d8 = ppVar12->first;
          pmVar13 = std::
                    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                  *)&__range1_1,&local_1d8.summary_id);
          std::vector<float,_std::allocator<float>_>::push_back
                    (pmVar13,(value_type_conflict2 *)&s_1);
          std::_Rb_tree_iterator<std::pair<const_summary_id_period_key,_float>_>::operator++
                    (&__end3_1);
        }
        WriteExceedanceProbabilityTable
                  (this,fileIDs,
                   (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                    *)&__range1_1,(double)this->totalperiods_,
                   items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,(int)__range3,
                   in_stack_00000008,1);
        std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair
                  ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&__range3);
        std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
        operator++(&__end2);
      }
    }
    std::
    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::~map((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
            *)&__range1_1);
    std::
    map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
    ::~map((map<summary_id_period_key,_float,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_float>_>_>
            *)&__range1);
  }
  return;
}

Assistant:

void aggreports::SampleMean(const std::vector<int> &fileIDs,
			    OASIS_FLOAT (OutLosses::*GetOutLoss)(),
			    const int epcalc, const int eptype,
			    const int eptype_tvar) {

  if (samplesize_ == 0) return;   // Prevent division by zero error

  std::map<summary_id_period_key, OASIS_FLOAT> items;
  for (auto x : (*out_loss_)[SAMPLES]) {
    summary_id_period_key sk;
    sk.summary_id = x.first.summary_id;
    sk.period_no = x.first.period_no;
    items[sk] += ((x.second.*GetOutLoss)() / samplesize_);
  }

  std::map<int, lossvec> mean_map;
  for (auto s : items) {
    mean_map[s.first.summary_id].push_back(s.second);
  }

  WriteExceedanceProbabilityTable(fileIDs, mean_map, totalperiods_, epcalc,
				  eptype, eptype_tvar);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    summary_id_period_key sk;
	    sk.summary_id = x.first.summary_id;
	    sk.period_no = x.first.period_no;
	    items[sk] += ((x.second.*GetOutLoss)() / ensemble.second.size());
	  }
	}
      }
      mean_map.clear();
      for (auto s : items) {
	mean_map[s.first.summary_id].push_back(s.second);
      }
      WriteExceedanceProbabilityTable(fileIDs, mean_map, totalperiods_, epcalc,
				      ensemble.first, eptype_tvar, 1);
    }
  }

}